

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_tableref.cpp
# Opt level: O1

unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> __thiscall
duckdb::SubqueryRef::Deserialize(SubqueryRef *this,Deserializer *deserializer)

{
  int iVar1;
  SubqueryRef *this_00;
  pointer pSVar2;
  byte bVar3;
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> _Var4;
  unique_ptr<duckdb::SubqueryRef,_std::default_delete<duckdb::SubqueryRef>,_true> result;
  _Head_base<0UL,_duckdb::SubqueryRef_*,_false> local_38;
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> local_30;
  
  this_00 = (SubqueryRef *)operator_new(0x70);
  SubqueryRef(this_00);
  local_38._M_head_impl = this_00;
  pSVar2 = unique_ptr<duckdb::SubqueryRef,_std::default_delete<duckdb::SubqueryRef>,_true>::
           operator->((unique_ptr<duckdb::SubqueryRef,_std::default_delete<duckdb::SubqueryRef>,_true>
                       *)&local_38);
  iVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,200,"subquery");
  bVar3 = (byte)iVar1;
  if (bVar3 == 0) {
    _Var4._M_head_impl =
         (pSVar2->subquery).
         super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
         .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl;
    (pSVar2->subquery).
    super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t.
    super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
    .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl = (SelectStatement *)0x0;
    if (_Var4._M_head_impl == (SelectStatement *)0x0) {
      bVar3 = 0;
      goto LAB_01782f40;
    }
  }
  else {
    iVar1 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar1 == '\0') {
      local_30._M_head_impl = (SelectStatement *)0x0;
    }
    else {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      SelectStatement::Deserialize((SelectStatement *)&stack0xffffffffffffffd0,deserializer);
      (*deserializer->_vptr_Deserializer[7])(deserializer);
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    _Var4._M_head_impl =
         (pSVar2->subquery).
         super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
         .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl;
    (pSVar2->subquery).
    super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t.
    super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
    .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl = local_30._M_head_impl;
    if (_Var4._M_head_impl == (SelectStatement *)0x0) {
      bVar3 = 1;
      goto LAB_01782f40;
    }
  }
  (*((_Var4._M_head_impl)->super_SQLStatement)._vptr_SQLStatement[1])();
LAB_01782f40:
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)bVar3);
  pSVar2 = unique_ptr<duckdb::SubqueryRef,_std::default_delete<duckdb::SubqueryRef>,_true>::
           operator->((unique_ptr<duckdb::SubqueryRef,_std::default_delete<duckdb::SubqueryRef>,_true>
                       *)&local_38);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<std::__cxx11::string,true>>
            (deserializer,0xc9,"column_name_alias",&(pSVar2->super_TableRef).column_name_alias);
  (this->super_TableRef)._vptr_TableRef = (_func_int **)local_38._M_head_impl;
  return (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)
         (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)this;
}

Assistant:

unique_ptr<TableRef> SubqueryRef::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<SubqueryRef>(new SubqueryRef());
	deserializer.ReadPropertyWithDefault<unique_ptr<SelectStatement>>(200, "subquery", result->subquery);
	deserializer.ReadPropertyWithDefault<vector<string>>(201, "column_name_alias", result->column_name_alias);
	return std::move(result);
}